

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_add_integer_into(mp_int *r,mp_int *a,uintmax_t n)

{
  uintmax_t n_local;
  mp_int *a_local;
  mp_int *r_local;
  
  mp_add_masked_integer_into(r->w,r->nw,a,n,0xffffffffffffffff,0,0);
  return;
}

Assistant:

void mp_add_integer_into(mp_int *r, mp_int *a, uintmax_t n)
{
    mp_add_masked_integer_into(r->w, r->nw, a, n, ~(BignumInt)0, 0, 0);
}